

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

void __thiscall hmac_hash::SHA1::buffer_to_block(SHA1 *this,uint8_t *buffer,uint32_t *block)

{
  ulong local_28;
  size_t i;
  uint32_t *block_local;
  uint8_t *buffer_local;
  SHA1 *this_local;
  
  for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 1) {
    block[local_28] =
         (uint)buffer[local_28 * 4] << 0x18 | (uint)buffer[local_28 * 4 + 1] << 0x10 |
         (uint)buffer[local_28 * 4 + 2] << 8 | (uint)buffer[local_28 * 4 + 3];
  }
  return;
}

Assistant:

void SHA1::buffer_to_block(const uint8_t* buffer, uint32_t* block) {
        for (size_t i = 0; i < BLOCK_INTS; ++i) {
            block[i] =
                (static_cast<uint32_t>(buffer[4 * i + 0]) << 24) |
                (static_cast<uint32_t>(buffer[4 * i + 1]) << 16) |
                (static_cast<uint32_t>(buffer[4 * i + 2]) << 8)  |
                (static_cast<uint32_t>(buffer[4 * i + 3]) << 0);
        }
    }